

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool __thiscall
tinyusdz::Stage::find_prim_by_prim_id(Stage *this,uint64_t prim_id,Prim **prim,string *err)

{
  bool bVar1;
  Prim *local_38;
  Prim *c_prim;
  string *err_local;
  Prim **prim_local;
  uint64_t prim_id_local;
  Stage *this_local;
  
  local_38 = (Prim *)0x0;
  c_prim = (Prim *)err;
  err_local = (string *)prim;
  prim_local = (Prim **)prim_id;
  prim_id_local = (uint64_t)this;
  bVar1 = find_prim_by_prim_id(this,prim_id,&local_38,err);
  if (bVar1) {
    *(Prim **)err_local = local_38;
  }
  return bVar1;
}

Assistant:

bool Stage::find_prim_by_prim_id(const uint64_t prim_id, Prim *&prim,
                                 std::string *err) {
  const Prim *c_prim{nullptr};
  if (!find_prim_by_prim_id(prim_id, c_prim, err)) {
    return false;
  }

  // remove const
  prim = const_cast<Prim *>(c_prim);

  return true;
}